

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# work_queue.h
# Opt level: O1

void __thiscall
WorkQueue<CMU462::WorkItem>::put_work(WorkQueue<CMU462::WorkItem> *this,WorkItem *item)

{
  pointer *ppWVar1;
  iterator __position;
  int iVar2;
  int iVar3;
  int iVar4;
  
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)&this->lock);
  if (iVar4 == 0) {
    __position._M_current =
         (this->storage).super__Vector_base<CMU462::WorkItem,_std::allocator<CMU462::WorkItem>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->storage).super__Vector_base<CMU462::WorkItem,_std::allocator<CMU462::WorkItem>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<CMU462::WorkItem,std::allocator<CMU462::WorkItem>>::
      _M_realloc_insert<CMU462::WorkItem_const&>
                ((vector<CMU462::WorkItem,std::allocator<CMU462::WorkItem>> *)this,__position,item);
    }
    else {
      iVar4 = item->tile_y;
      iVar2 = item->tile_w;
      iVar3 = item->tile_h;
      (__position._M_current)->tile_x = item->tile_x;
      (__position._M_current)->tile_y = iVar4;
      (__position._M_current)->tile_w = iVar2;
      (__position._M_current)->tile_h = iVar3;
      ppWVar1 = &(this->storage).
                 super__Vector_base<CMU462::WorkItem,_std::allocator<CMU462::WorkItem>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppWVar1 = *ppWVar1 + 1;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->lock);
    return;
  }
  std::__throw_system_error(iVar4);
}

Assistant:

void put_work(const T& item) {
      lock.lock();
      storage.push_back(item);
      lock.unlock();
    }